

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O1

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
 __thiscall
tchecker::
pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,tchecker::zg::path::concrete::edge_t>,unsigned_long,1ul>>
::
construct<std::tuple<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>const>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>const>,bool,bool>const&>
          (pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,tchecker::zg::path::concrete::edge_t>,unsigned_long,1ul>>
           *this,tuple<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>,_bool,_bool>
                 *args)

{
  undefined8 *puVar1;
  long in_RDX;
  refcount_t *refcount;
  
  puVar1 = (undefined8 *)
           pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
           ::allocate((pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
                       *)args);
  if (puVar1 == (undefined8 *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    zg::path::concrete::node_t::node_t
              ((node_t *)(puVar1 + 1),(const_state_sptr_t *)(in_RDX + 0x10),
               (const_clockval_sptr_t *)(in_RDX + 8),*(bool *)(in_RDX + 1),*(bool *)in_RDX);
    puVar1[4] = 0;
    puVar1[5] = 0;
    *puVar1 = 0;
    *(undefined8 *)this = 0;
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
    ::reset((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
             *)this,(make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                     *)(puVar1 + 1));
  }
  return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
          )(make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
            *)this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> construct(ARGS &&... args)
  {
    void * t = allocate();
    if (t == nullptr)
      return tchecker::intrusive_shared_ptr_t<T>(nullptr);
    // p points after the reference counter
    void * p = static_cast<typename T::refcount_t *>(t) + 1;
    try {
      T::construct(p, std::forward<ARGS>(args)...); // construct T in p with args
    }
    catch (...) {
      this->release(t);
      throw;
    }
    return tchecker::intrusive_shared_ptr_t<T>(reinterpret_cast<T *>(p));
  }